

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::RadixHTGlobalSourceState::AssignTask
          (RadixHTGlobalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTLocalSourceState *lstate,InterruptState *interrupt_state)

{
  AggregatePartitionState AVar1;
  size_type __n;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var2;
  undefined1 uVar3;
  SourceResultType SVar4;
  reference this_00;
  type this_01;
  InternalException *this_02;
  long lVar5;
  allocator local_69;
  unique_lock<std::mutex> partition_guard;
  unique_lock<std::mutex> guard;
  string local_48;
  
  ::std::unique_lock<std::mutex>::unique_lock
            (&guard,&(sink->super_GlobalSinkState).super_StateWithBlockableTasks.lock);
  if ((((this->finished)._M_base._M_i & 1U) != 0) ||
     (__n = this->task_idx,
     __n == (long)(sink->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(sink->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    _Var2._M_head_impl =
         (lstate->ht).
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (lstate->ht).
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         (GroupedAggregateHashTable *)0x0;
    SVar4 = FINISHED;
    if (_Var2._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
    goto LAB_01958ddc;
  }
  this->task_idx = __n + 1;
  lstate->task_idx = __n;
  this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::get<true>(&sink->partitions,__n);
  this_01 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
            ::operator*(this_00);
  ::std::unique_lock<std::mutex>::unique_lock
            (&partition_guard,&(this_01->super_StateWithBlockableTasks).lock);
  AVar1 = this_01->state;
  if (AVar1 == READY_TO_FINALIZE) {
    this_01->state = FINALIZE_IN_PROGRESS;
    uVar3 = 1;
    lVar5 = 8;
LAB_01958dcd:
    *(undefined1 *)((long)&(lstate->super_LocalSourceState)._vptr_LocalSourceState + lVar5) = uVar3;
    SVar4 = HAVE_MORE_OUTPUT;
  }
  else {
    if (AVar1 != FINALIZE_IN_PROGRESS) {
      if (AVar1 != READY_TO_SCAN) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_48,
                   "Unexpected AggregatePartitionState in RadixHTLocalSourceState::Finalize!",
                   &local_69);
        InternalException::InternalException(this_02,&local_48);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lstate->task = SCAN;
      lVar5 = 0x20;
      uVar3 = 0;
      goto LAB_01958dcd;
    }
    lstate->task = SCAN;
    lstate->scan_status = INIT;
    SVar4 = StateWithBlockableTasks::BlockSource
                      (&this_01->super_StateWithBlockableTasks,&partition_guard,interrupt_state);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&partition_guard);
LAB_01958ddc:
  ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  return SVar4;
}

Assistant:

SourceResultType RadixHTGlobalSourceState::AssignTask(RadixHTGlobalSinkState &sink, RadixHTLocalSourceState &lstate,
                                                      InterruptState &interrupt_state) {
	// First, try to get a partition index
	auto guard = sink.Lock();
	if (finished || task_idx == sink.partitions.size()) {
		lstate.ht.reset();
		return SourceResultType::FINISHED;
	}
	lstate.task_idx = task_idx++;

	// We got a partition index
	auto &partition = *sink.partitions[lstate.task_idx];
	auto partition_guard = partition.Lock();
	switch (partition.state) {
	case AggregatePartitionState::READY_TO_FINALIZE:
		partition.state = AggregatePartitionState::FINALIZE_IN_PROGRESS;
		lstate.task = RadixHTSourceTaskType::FINALIZE;
		return SourceResultType::HAVE_MORE_OUTPUT;
	case AggregatePartitionState::FINALIZE_IN_PROGRESS:
		lstate.task = RadixHTSourceTaskType::SCAN;
		lstate.scan_status = RadixHTScanStatus::INIT;
		return partition.BlockSource(partition_guard, interrupt_state);
	case AggregatePartitionState::READY_TO_SCAN:
		lstate.task = RadixHTSourceTaskType::SCAN;
		lstate.scan_status = RadixHTScanStatus::INIT;
		return SourceResultType::HAVE_MORE_OUTPUT;
	default:
		throw InternalException("Unexpected AggregatePartitionState in RadixHTLocalSourceState::Finalize!");
	}
}